

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O2

bool __thiscall
USBSignalFilter::GetPacket(USBSignalFilter *this,USBPacket *pckt,USBSignalState *sgnl)

{
  pointer puVar1;
  pointer puVar2;
  USBPacket *this_00;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  Channel *pCVar10;
  uint uVar11;
  uint uVar12;
  pointer puVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  U8 bits2add [7];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bits;
  U8 val;
  undefined7 uStack_77;
  U64 UStack_70;
  USBState local_68;
  undefined4 uStack_64;
  double dStack_60;
  USBPacket *local_50;
  double local_48;
  double dStack_40;
  
  USBPacket::Clear(pckt);
  bits2add[4] = '\x01';
  bits2add[5] = '\x01';
  bits2add[6] = '\x01';
  bits2add[0] = '\0';
  bits2add[1] = '\x01';
  bits2add[2] = '\x01';
  bits2add[3] = '\x01';
  if (this->mExpectLowSpeed == false) {
    dVar15 = *(double *)(&DAT_00154170 + (ulong)(this->mSpeed == FULL_SPEED) * 8);
  }
  else {
    dVar15 = sgnl->mDur;
    if ((((dVar15 <= 24.999999999999996) || (625.0 <= dVar15)) || (S_J < sgnl->mState)) ||
       ((int)(dVar15 / 83.33333333333333 + 0.5) != 1)) {
      this->mSpeed = LOW_SPEED;
      dVar15 = 666.6666666666666;
    }
    else {
      this->mSpeed = FULL_SPEED;
      this->mExpectLowSpeed = false;
      dVar15 = 83.33333333333333;
    }
  }
  uVar6 = Analyzer::GetSampleRate();
  dVar15 = dVar15 / (1000000000.0 / (double)uVar6);
  bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pckt->mSampleBegin = sgnl->mSampleBegin;
  bVar4 = false;
  bVar14 = false;
  dVar18 = 0.0;
  local_50 = pckt;
  while (bVar3 = USBSignalState::IsData(sgnl,this->mSpeed), this_00 = local_50,
        bVar4 == false && (~bVar3 & 1U) == 0) {
    uVar6 = (uint)(sgnl->mDur / *(double *)(&DAT_00154170 + (ulong)(this->mSpeed == FULL_SPEED) * 8)
                  + 0.5);
    if (0 < (int)uVar6) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&bits,
                 (const_iterator)
                 bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,bits2add + bVar14,bits2add + uVar6);
    }
    uVar12 = 0;
    uVar11 = 0;
    if (0 < (int)uVar6) {
      uVar11 = uVar6;
    }
    for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      dVar17 = (double)(int)uVar12;
      if ((bool)(uVar12 != 0 | ~bVar14 & 1U)) {
        dVar16 = dVar15 * dVar17 + 0.5;
        uVar7 = (ulong)dVar16;
        _val = ((long)(dVar16 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7) +
               sgnl->mSampleBegin;
        local_48 = dVar17;
        dStack_40 = dVar18;
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
        emplace_back<unsigned_long_long>(&pckt->mBitBeginSamples,(unsigned_long_long *)&val);
        dVar17 = local_48;
        dVar18 = dStack_40;
      }
      dVar17 = (dVar17 + 0.5) * dVar15 + 0.5;
      lVar8 = (long)dVar17;
      pCVar10 = (Channel *)0xa;
      if (uVar12 == 0) {
        pCVar10 = (Channel *)(ulong)((uint)(byte)~bVar14 * 4 + 7);
      }
      AnalyzerResults::AddMarker
                ((ulonglong)this->mResults,
                 ((uint)(long)(dVar17 - 9.223372036854776e+18) & (uint)(lVar8 >> 0x3f) | (uint)lVar8
                 ) + (int)sgnl->mSampleBegin,pCVar10);
    }
    if (this->mSpeed == FULL_SPEED) {
      if ((long)bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0x10) {
        _val = 0x100000000000000;
        UStack_70 = 0x10101010000;
        bVar4 = std::__equal<true>::equal<unsigned_char>
                          (bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                           bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&val);
        if (bVar4) {
          this->mSpeed = LOW_SPEED;
          this->mExpectLowSpeed = true;
        }
      }
      else {
        bVar4 = false;
      }
    }
    else {
      bVar4 = false;
    }
    GetState((USBSignalState *)&val,this);
    bVar14 = uVar6 == 7;
    sgnl->mState = local_68;
    *(undefined4 *)&sgnl->field_0x14 = uStack_64;
    sgnl->mDur = dStack_60;
    sgnl->mSampleBegin = _val;
    sgnl->mSampleEnd = UStack_70;
    dVar18 = dStack_60;
  }
  local_50->mSampleEnd = sgnl->mSampleEnd;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            (&pckt->mBitBeginSamples,&sgnl->mSampleBegin);
  if (((bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) &&
      (((int)bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
        (int)bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start & 7U) == 0)) &&
     (puVar1 = (this_00->mBitBeginSamples).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_start,
     (*(int *)&(this_00->mBitBeginSamples).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish - (int)puVar1 & 0x38U) == 8)) {
    this_00->mSampleBegin = *puVar1;
    this_00->mSampleEnd = (long)(dVar15 + 0.5) + sgnl->mSampleEnd;
    _val = _val & 0xffffffffffffff00;
    puVar13 = bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar7 = (long)puVar13 -
              (long)bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      bVar9 = val;
      do {
        uVar7 = uVar7 + 1;
        if (puVar13 ==
            bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          puVar13 = (this_00->mData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar2 = (this_00->mData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar7 = (long)puVar2 - (long)puVar13;
          if (1 < uVar7) {
            this_00->mPID = (uint)puVar13[1];
            if (3 < uVar7) {
              if (uVar7 == 4) {
                uVar5 = (ushort)(puVar2[-1] >> 3);
              }
              else {
                uVar5 = CONCAT11(puVar2[-1],puVar2[-2]);
              }
              this_00->mCRC = uVar5;
            }
          }
          bVar14 = USBPacket::IsTokenPacket(this_00);
          if ((((bVar14) &&
               (bVar14 = true,
               (long)(this_00->mData).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this_00->mData).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start == 4)) ||
              (((this_00->mPID == PID_DATA0 || (this_00->mPID == PID_DATA1)) &&
               (bVar14 = true,
               3 < (ulong)((long)(this_00->mData).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this_00->mData).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start))))) ||
             ((bVar14 = USBPacket::IsHandshakePacket(this_00), bVar14 &&
              (bVar14 = true,
              (long)(this_00->mData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this_00->mData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start == 2)))) goto LAB_00137f3f;
          if (this_00->mPID == PID_SOF) {
            bVar14 = (long)(this_00->mData).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(this_00->mData).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start == 4;
          }
          else {
            if (this_00->mPID != PID_PRE) goto LAB_00137f3d;
            bVar14 = (long)(this_00->mData).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(this_00->mData).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start == 2;
          }
          goto LAB_00137f3f;
        }
        bVar9 = bVar9 >> 1;
        if (*puVar13 != '\0') {
          bVar9 = bVar9 | 0x80;
        }
        _val = CONCAT71(uStack_77,bVar9);
        puVar13 = puVar13 + 1;
      } while ((uVar7 & 7) != 0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this_00->mData,&val);
    } while( true );
  }
LAB_00137f3d:
  bVar14 = false;
LAB_00137f3f:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar14;
}

Assistant:

bool USBSignalFilter::GetPacket( USBPacket& pckt, USBSignalState& sgnl )
{
    pckt.Clear();

    const U8 bits2add[] = { 0, 1, 1, 1, 1, 1, 1 };

    // a PRE packet switched us into low speed mode, so now we need to check
    // if this packet is low or full speed
    if( mExpectLowSpeed )
    {
        if( sgnl.IsData( FULL_SPEED ) && sgnl.GetNumBits( FULL_SPEED ) == 1 )
        {
            mSpeed = FULL_SPEED;
            mExpectLowSpeed = false; // switch back to full speed
        }
        else
        {
            mSpeed = LOW_SPEED;
        }
    }

    const double BIT_DUR = ( mSpeed == FULL_SPEED ? FS_BIT_DUR : LS_BIT_DUR );
    const double SAMPLE_DUR = 1e9 / mAnalyzer->GetSampleRate(); // 1 sample duration in ns
    const double BIT_SAMPLES = BIT_DUR / SAMPLE_DUR;

    std::vector<U8> bits;

    pckt.mSampleBegin = sgnl.mSampleBegin; // default for bad packets

    bool is_stuff_bit = false;
    bool is_pre_packet = false;
    while( sgnl.IsData( mSpeed ) && !is_pre_packet )
    {
        // get the number of bits in this signal
        int num_bits = sgnl.GetNumBits( mSpeed );

        const U8* add_begin = bits2add;
        const U8* add_end = bits2add + num_bits;

        // mind the stuffing bit
        if( is_stuff_bit )
            ++add_begin;

        // now add the data bits
        if( ( is_stuff_bit && num_bits > 1 ) || ( num_bits > 0 ) )
            bits.insert( bits.end(), add_begin, add_end );

        // do the bit markers and remember the samples at which a bit begins
        int bc;
        for( bc = 0; bc < num_bits; ++bc )
        {
            if( !is_stuff_bit || bc > 0 )
                pckt.mBitBeginSamples.push_back( sgnl.mSampleBegin + U64( BIT_SAMPLES * bc + .5 ) );

            mResults->AddMarker( sgnl.mSampleBegin + U64( BIT_SAMPLES * ( bc + .5 ) + .5 ),
                                 bc == 0 ? ( is_stuff_bit ? AnalyzerResults::ErrorX : AnalyzerResults::Zero ) : AnalyzerResults::One,
                                 mSettings->mDPChannel );
        }

        // check if this is a PRE token, in which case we switch to low-speed,
        // return and wait for the next packet
        if( mSpeed == FULL_SPEED && bits.size() == 16 ) // 8 bits for SYNC and 8 bits for PRE PID
        {
            const U8 preArr[ 16 ] = { 0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 1, 1, 1, 1, 0, 0 }; // SYNC and PRE as they appear on the bus
            if( std::equal( bits.begin(), bits.end(), preArr ) )
            {
                mSpeed = LOW_SPEED;
                mExpectLowSpeed = true;
                is_pre_packet = true;
            }
        }

        // set the stuff bit flag for the next state
        is_stuff_bit = ( num_bits == 7 );

        // get the next signal state
        sgnl = GetState();
    }

    pckt.mSampleEnd = sgnl.mSampleEnd; // default for bad packets

    // add another element to mBitBeginSamples to mark the end of the last bit
    pckt.mBitBeginSamples.push_back( sgnl.mSampleBegin );

    // check the number of bits
    if( bits.empty() || ( bits.size() % 8 ) != 0 || ( pckt.mBitBeginSamples.size() % 8 ) != 1 )
    {
        return false;
    }

    // remember the begin & end samples for the entire packet
    pckt.mSampleBegin = pckt.mBitBeginSamples.front();
    pckt.mSampleEnd = sgnl.mSampleEnd + S64( BIT_DUR / SAMPLE_DUR + 0.5 );

    // make bytes out of these bits
    U8 val = 0;
    std::vector<U8>::iterator i( bits.begin() );
    while( i != bits.end() )
    {
        // least significant bit first
        val >>= 1;
        if( *i )
            val |= 0x80;

        ++i;

        // do we have a full byte?
        if( ( ( i - bits.begin() ) % 8 ) == 0 )
            pckt.mData.push_back( val );
    }

    // extract the PID
    if( pckt.mData.size() > 1 )
        pckt.mPID = USB_PID( pckt.mData[ 1 ] );

    // extract the CRC fields
    if( pckt.mData.size() >= 4 )
    {
        U16 last_word = ( pckt.mData.back() << 8 ) | *( pckt.mData.end() - 2 );

        if( pckt.mData.size() == 4 )
            pckt.mCRC = last_word >> 11;
        else
            pckt.mCRC = last_word;
    }

    return ( pckt.IsTokenPacket() && pckt.mData.size() == 4 ) || ( pckt.IsDataPacket() && pckt.mData.size() >= 4 ) ||
           ( pckt.IsHandshakePacket() && pckt.mData.size() == 2 ) || ( pckt.mPID == PID_PRE && pckt.mData.size() == 2 ) ||
           ( pckt.IsSOFPacket() && pckt.mData.size() == 4 );
}